

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O0

bool __thiscall
dap::json::JsonCppSerializer::object
          (JsonCppSerializer *this,function<bool_(dap::FieldSerializer_*)> *cb)

{
  Value **this_00;
  bool bVar1;
  undefined1 local_50 [8];
  FS fs;
  function<bool_(dap::FieldSerializer_*)> *cb_local;
  JsonCppSerializer *this_local;
  
  this_00 = &fs.json;
  Json::Value::Value((Value *)this_00,objectValue);
  Json::Value::operator=(this->json,(Value *)this_00);
  Json::Value::~Value((Value *)this_00);
  object(std::function<bool(dap::FieldSerializer*)>const&)::FS::FS(Json::Value__
            ((FieldSerializer *)local_50,this->json);
  bVar1 = std::function<bool_(dap::FieldSerializer_*)>::operator()(cb,(FieldSerializer *)local_50);
  object::FS::~FS((FS *)local_50);
  return bVar1;
}

Assistant:

bool JsonCppSerializer::object(
    const std::function<bool(dap::FieldSerializer*)>& cb) {
  struct FS : public FieldSerializer {
    Json::Value* const json;

    FS(Json::Value* json) : json(json) {}
    bool field(const std::string& name, const SerializeFunc& cb) override {
      JsonCppSerializer s(&(*json)[name]);
      auto res = cb(&s);
      if (s.removed) {
        json->removeMember(name);
      }
      return res;
    }
  };

  *json = Json::Value(Json::objectValue);
  FS fs{json};
  return cb(&fs);
}